

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O3

void __thiscall classSHA256::finalize(classSHA256 *this,void *hash,size_t len)

{
  uint32_t *__src;
  uint32_t *puVar1;
  uint64_t uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  size_t __n;
  void *__s;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  __src = (this->state).w;
  uVar32 = (ulong)(this->state).chunkSize;
  *(undefined1 *)((long)(this->state).w + uVar32) = 0x80;
  uVar30 = (ulong)(this->state).chunkSize;
  __s = (void *)((long)(this->state).w + uVar30 + 1);
  if (uVar32 < 0x38) {
    memset(__s,0,0x37 - uVar30);
  }
  else {
    memset(__s,0,0x3f - uVar30);
    processChunk(this);
    (this->state).w[8] = 0;
    (this->state).w[9] = 0;
    (this->state).w[10] = 0;
    (this->state).w[0xb] = 0;
    (this->state).w[4] = 0;
    (this->state).w[5] = 0;
    (this->state).w[6] = 0;
    (this->state).w[7] = 0;
    __src[0] = 0;
    __src[1] = 0;
    __src[2] = 0;
    __src[3] = 0;
    (this->state).w[0xc] = 0;
    (this->state).w[0xd] = 0;
  }
  uVar2 = (this->state).length;
  uVar29 = (uint)(uVar2 >> 0x20);
  (this->state).w[0xe] =
       uVar29 << 0x18 | (uint)(byte)(uVar2 >> 0x38) | uVar29 >> 8 & 0xff00 | (uVar29 & 0xff00) << 8;
  uVar29 = (uint)uVar2;
  (this->state).w[0xf] =
       uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18;
  processChunk(this);
  lVar31 = -8;
  do {
    auVar33 = *(undefined1 (*) [16])(__src + lVar31);
    auVar34[1] = 0;
    auVar34[0] = auVar33[8];
    auVar34[2] = auVar33[9];
    auVar34[3] = 0;
    auVar34[4] = auVar33[10];
    auVar34[5] = 0;
    auVar34[6] = auVar33[0xb];
    auVar34[7] = 0;
    auVar34[8] = auVar33[0xc];
    auVar34[9] = 0;
    auVar34[10] = auVar33[0xd];
    auVar34[0xb] = 0;
    auVar34[0xc] = auVar33[0xe];
    auVar34[0xd] = 0;
    auVar34[0xe] = auVar33[0xf];
    auVar34[0xf] = 0;
    auVar34 = pshuflw(auVar34,auVar34,0x1b);
    auVar34 = pshufhw(auVar34,auVar34,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar33._0_13_;
    auVar19[0xe] = auVar33[7];
    auVar20[0xc] = auVar33[6];
    auVar20._0_12_ = auVar33._0_12_;
    auVar20._13_2_ = auVar19._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar33._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    auVar22[10] = auVar33[5];
    auVar22._0_10_ = auVar33._0_10_;
    auVar22._11_4_ = auVar21._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar33._0_9_;
    auVar23._10_5_ = auVar22._10_5_;
    auVar24[8] = auVar33[4];
    auVar24._0_8_ = auVar33._0_8_;
    auVar24._9_6_ = auVar23._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar24._8_7_;
    auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar27[0] = auVar33[3];
    auVar27._9_6_ = 0;
    auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar28[0] = auVar33[2];
    auVar28._11_4_ = 0;
    auVar25[2] = auVar33[1];
    auVar25._0_2_ = auVar33._0_2_;
    auVar25._3_12_ = SUB1512(auVar28 << 0x20,3);
    auVar33._0_2_ = auVar33._0_2_ & 0xff;
    auVar33._2_13_ = auVar25._2_13_;
    auVar33[0xf] = 0;
    auVar33 = pshuflw(auVar33,auVar33,0x1b);
    auVar33 = pshufhw(auVar33,auVar33,0x1b);
    sVar3 = auVar33._0_2_;
    sVar4 = auVar33._2_2_;
    sVar5 = auVar33._4_2_;
    sVar6 = auVar33._6_2_;
    sVar7 = auVar33._8_2_;
    sVar8 = auVar33._10_2_;
    sVar9 = auVar33._12_2_;
    sVar10 = auVar33._14_2_;
    sVar11 = auVar34._0_2_;
    sVar12 = auVar34._2_2_;
    sVar13 = auVar34._4_2_;
    sVar14 = auVar34._6_2_;
    sVar15 = auVar34._8_2_;
    sVar16 = auVar34._10_2_;
    sVar17 = auVar34._12_2_;
    sVar18 = auVar34._14_2_;
    puVar1 = (this->state).w + lVar31 + 8;
    *(char *)puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar33[0] - (0xff < sVar3);
    *(char *)((long)puVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar33[2] - (0xff < sVar4);
    *(char *)((long)puVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar33[4] - (0xff < sVar5);
    *(char *)((long)puVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar33[6] - (0xff < sVar6);
    *(char *)(puVar1 + 1) = (0 < sVar7) * (sVar7 < 0x100) * auVar33[8] - (0xff < sVar7);
    *(char *)((long)puVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar33[10] - (0xff < sVar8);
    *(char *)((long)puVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0xc] - (0xff < sVar9);
    *(char *)((long)puVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar33[0xe] - (0xff < sVar10);
    *(char *)(puVar1 + 2) = (0 < sVar11) * (sVar11 < 0x100) * auVar34[0] - (0xff < sVar11);
    *(char *)((long)puVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar34[2] - (0xff < sVar12);
    *(char *)((long)puVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar34[4] - (0xff < sVar13);
    *(char *)((long)puVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar34[6] - (0xff < sVar14);
    *(char *)(puVar1 + 3) = (0 < sVar15) * (sVar15 < 0x100) * auVar34[8] - (0xff < sVar15);
    *(char *)((long)puVar1 + 0xd) = (0 < sVar16) * (sVar16 < 0x100) * auVar34[10] - (0xff < sVar16);
    *(char *)((long)puVar1 + 0xe) = (0 < sVar17) * (sVar17 < 0x100) * auVar34[0xc] - (0xff < sVar17)
    ;
    *(char *)((long)puVar1 + 0xf) = (0 < sVar18) * (sVar18 < 0x100) * auVar34[0xe] - (0xff < sVar18)
    ;
    lVar31 = lVar31 + 4;
  } while (lVar31 != 0);
  __n = 0x20;
  if (len < 0x20) {
    __n = len;
  }
  memcpy(hash,__src,__n);
  return;
}

Assistant:

void classSHA256::finalize(void *hash, size_t len)
{
    // Pad the last chunk.  We may need two padding chunks if there
    // isn't enough room in the first for the padding and length.
    uint8_t *wbytes = (uint8_t *)state.w;
    if (state.chunkSize <= (64 - 9)) {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - 8 - (state.chunkSize + 1));
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    } else {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - (state.chunkSize + 1));
        processChunk();
        memset(wbytes, 0x00, 64 - 8);
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    }

    // Convert the result into big endian and return it.
    for (uint8_t posn = 0; posn < 8; ++posn)
        state.w[posn] = htobe32(state.h[posn]);

    // Copy the hash to the caller's return buffer.
    if (len > 32)
        len = 32;
    memcpy(hash, state.w, len);
}